

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

Bucket __thiscall
QHashPrivate::Data<QHashPrivate::Node<ProString,_QHashDummyValue>_>::findBucketWithHash<ProString>
          (Data<QHashPrivate::Node<ProString,_QHashDummyValue>_> *this,ProString *key,size_t hash)

{
  bool bVar1;
  Span *pSVar2;
  ulong uVar3;
  Span *pSVar4;
  Bucket BVar5;
  
  uVar3 = this->numBuckets - 1 & hash;
  pSVar2 = this->spans + (uVar3 >> 7);
  uVar3 = (ulong)((uint)uVar3 & 0x7f);
  do {
    if (pSVar2->offsets[uVar3] == 0xff) {
LAB_0027401b:
      bVar1 = false;
    }
    else {
      bVar1 = ProString::operator==
                        ((ProString *)
                         ((pSVar2->entries->storage).data + (uint)pSVar2->offsets[uVar3] * 0x30),key
                        );
      if (bVar1) goto LAB_0027401b;
      uVar3 = uVar3 + 1;
      bVar1 = true;
      if (uVar3 == 0x80) {
        pSVar4 = pSVar2 + 1;
        pSVar2 = this->spans;
        if (((long)pSVar4 - (long)this->spans >> 4) * -0x71c71c71c71c71c7 - (this->numBuckets >> 7)
            != 0) {
          pSVar2 = pSVar4;
        }
        uVar3 = 0;
      }
    }
    if (!bVar1) {
      BVar5.index = uVar3;
      BVar5.span = pSVar2;
      return BVar5;
    }
  } while( true );
}

Assistant:

Bucket findBucketWithHash(const K &key, size_t hash) const noexcept
    {
        static_assert(std::is_same_v<std::remove_cv_t<Key>, K> ||
                QHashHeterogeneousSearch<std::remove_cv_t<Key>, K>::value);
        Q_ASSERT(numBuckets > 0);
        Bucket bucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
        // loop over the buckets until we find the entry we search for
        // or an empty slot, in which case we know the entry doesn't exist
        while (true) {
            size_t offset = bucket.offset();
            if (offset == SpanConstants::UnusedEntry) {
                return bucket;
            } else {
                Node &n = bucket.nodeAtOffset(offset);
                if (qHashEquals(n.key, key))
                    return bucket;
            }
            bucket.advanceWrapped(this);
        }
    }